

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRefCount.cpp
# Opt level: O3

void testRefCount(void)

{
  code *pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  
  plVar3 = (long *)operator_new(0x10);
  plVar3[1] = 0;
  testRefCount::count = testRefCount::count + 1;
  *plVar3 = (long)&PTR__TestObject_0010ad78;
  LOCK();
  plVar3[1] = plVar3[1] + 1;
  UNLOCK();
  if (testRefCount::count != 1) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x13,"count == 1");
    if (iVar2 != 0) goto LAB_00102815;
  }
  LOCK();
  plVar4 = plVar3 + 1;
  *plVar4 = *plVar4 + -1;
  UNLOCK();
  if (*plVar4 == 0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  if (testRefCount::count == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x15,"count == 0");
    if (iVar2 != 0) goto LAB_00102815;
    iVar2 = testRefCount::count + 1;
  }
  plVar4 = (long *)operator_new(0x10);
  plVar4[1] = 0;
  *plVar4 = (long)&PTR__TestObject_0010ad78;
  LOCK();
  testRefCount::count = iVar2;
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  plVar3 = plVar4 + 1;
  if (testRefCount::count != 1) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x20,"count == 1");
    if (iVar2 != 0) goto LAB_00102815;
  }
  LOCK();
  *plVar3 = *plVar3 + -1;
  UNLOCK();
  if (*plVar3 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  LOCK();
  *plVar3 = *plVar3 + -1;
  UNLOCK();
  if (*plVar3 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  LOCK();
  *plVar3 = *plVar3 + -1;
  UNLOCK();
  if (*plVar3 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  if (testRefCount::count != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x22,"count == 0");
    if (iVar2 != 0) {
LAB_00102815:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void testRefCount()
{
  static int count = 0;

  class TestObject : public RefCount::Object
  {
  public:
    TestObject() {++count;}
    ~TestObject() {--count;}
  };

  // test construction and destruction
  {
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

  // test copy constructor
  {
    RefCount::Ptr<TestObject> ptr3;
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(ptr != ptr3);
    RefCount::Ptr<TestObject> ptr2(ptr);
    ASSERT(ptr == ptr2);
    ptr3 = ptr2;
    ASSERT(ptr == ptr3);
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

}